

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

string * __thiscall
Assimp::FBX::ParseTokenAsString_abi_cxx11_
          (string *__return_storage_ptr__,FBX *this,Token *t,char **err_out)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  t->sbegin = (char *)0x0;
  if (*(int *)(this + 0x10) == 2) {
    if (*(int *)(this + 0x20) == -1) {
      pcVar2 = *(char **)this;
      if (*pcVar2 == 'S') {
        iVar1 = *(int *)(pcVar2 + 1);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = pcVar2 + (long)iVar1 + 5;
        pcVar2 = pcVar2 + 5;
LAB_005bce39:
        err_out = (char **)&__return_storage_ptr__->field_2;
        goto LAB_005bcdf2;
      }
      pcVar2 = "failed to parse S(tring), unexpected data type (binary)";
    }
    else {
      pcVar2 = *(char **)this;
      err_out = *(char ***)(this + 8);
      if ((ulong)((long)err_out - (long)pcVar2) < 2) {
        pcVar2 = "token is too short to hold a string";
      }
      else {
        if ((*pcVar2 == '\"') && (*(char *)((long)err_out + -1) == '\"')) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = pcVar2 + (((long)err_out - (long)pcVar2) - 1);
          pcVar2 = pcVar2 + 1;
          goto LAB_005bce39;
        }
        pcVar2 = "expected double quoted string";
      }
    }
  }
  else {
    pcVar2 = "expected TOK_DATA token";
  }
  t->sbegin = pcVar2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = "";
  pcVar2 = "";
LAB_005bcdf2:
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar3,err_out);
  return __return_storage_ptr__;
}

Assistant:

std::string ParseTokenAsString(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return "";
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'S') {
            err_out = "failed to parse S(tring), unexpected data type (binary)";
            return "";
        }

        // read string length
        BE_NCONST int32_t len = SafeParse<int32_t>(data+1, t.end());
        AI_SWAP4(len);

        ai_assert(t.end() - data == 5 + len);
        return std::string(data + 5, len);
    }

    const size_t length = static_cast<size_t>(t.end() - t.begin());
    if(length < 2) {
        err_out = "token is too short to hold a string";
        return "";
    }

    const char* s = t.begin(), *e = t.end() - 1;
    if (*s != '\"' || *e != '\"') {
        err_out = "expected double quoted string";
        return "";
    }

    return std::string(s+1,length-2);
}